

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TypeAssignmentSyntax::setChild
          (TypeAssignmentSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  EqualsTypeClauseSyntax *pEVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffc8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x25046a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pEVar2 = (EqualsTypeClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x25047a);
      pEVar2 = SyntaxNode::as<slang::syntax::EqualsTypeClauseSyntax>(pSVar1);
    }
    *(EqualsTypeClauseSyntax **)(in_RDI + 0x28) = pEVar2;
  }
  return;
}

Assistant:

void TypeAssignmentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: assignment = child.node() ? &child.node()->as<EqualsTypeClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}